

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSSBOLayoutCase.cpp
# Opt level: O0

ostream * vkt::ssbo::operator<<(ostream *stream,BufferVarLayoutEntry *entry)

{
  ostream *poVar1;
  char *pcVar2;
  BufferVarLayoutEntry *entry_local;
  ostream *stream_local;
  
  poVar1 = std::operator<<(stream,(string *)entry);
  poVar1 = std::operator<<(poVar1," { type = ");
  pcVar2 = glu::getDataTypeName(entry->type);
  poVar1 = std::operator<<(poVar1,pcVar2);
  poVar1 = std::operator<<(poVar1,", blockNdx = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,entry->blockNdx);
  poVar1 = std::operator<<(poVar1,", offset = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,entry->offset);
  poVar1 = std::operator<<(poVar1,", arraySize = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,entry->arraySize);
  poVar1 = std::operator<<(poVar1,", arrayStride = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,entry->arrayStride);
  poVar1 = std::operator<<(poVar1,", matrixStride = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,entry->matrixStride);
  poVar1 = std::operator<<(poVar1,", topLevelArraySize = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,entry->topLevelArraySize);
  poVar1 = std::operator<<(poVar1,", topLevelArrayStride = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,entry->topLevelArrayStride);
  poVar1 = std::operator<<(poVar1,", isRowMajor = ");
  pcVar2 = "false";
  if ((entry->isRowMajor & 1U) != 0) {
    pcVar2 = "true";
  }
  poVar1 = std::operator<<(poVar1,pcVar2);
  std::operator<<(poVar1," }");
  return stream;
}

Assistant:

std::ostream& operator<< (std::ostream& stream, const BufferVarLayoutEntry& entry)
{
	stream << entry.name << " { type = " << glu::getDataTypeName(entry.type)
		   << ", blockNdx = " << entry.blockNdx
		   << ", offset = " << entry.offset
		   << ", arraySize = " << entry.arraySize
		   << ", arrayStride = " << entry.arrayStride
		   << ", matrixStride = " << entry.matrixStride
		   << ", topLevelArraySize = " << entry.topLevelArraySize
		   << ", topLevelArrayStride = " << entry.topLevelArrayStride
		   << ", isRowMajor = " << (entry.isRowMajor ? "true" : "false")
		   << " }";
	return stream;
}